

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucky.c
# Opt level: O1

uint luckyCanonicizer1_simple
               (word *pInOut,word *pAux,word *pAux1,int nVars,char *pCanonPerm,uint CanonPhase)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  if (0x10 < nVars) {
    __assert_fail("nVars <= 16",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/lucky/lucky.c"
                  ,0x244,
                  "unsigned int luckyCanonicizer1_simple(word *, word *, word *, int, char *, unsigned int)"
                 );
  }
  do {
    iVar1 = minimalInitialFlip1(pInOut,nVars);
    iVar2 = minimalFlip1(pInOut,pAux,pAux1,nVars);
    iVar3 = minimalSwap1(pInOut,pAux,pAux1,nVars);
  } while (iVar3 != 0 || iVar2 + iVar1 != 0);
  return CanonPhase;
}

Assistant:

unsigned luckyCanonicizer1_simple(word* pInOut, word* pAux, word* pAux1, int  nVars, char * pCanonPerm, unsigned CanonPhase)
{
    int counter=1;
    assert( nVars <= 16 );
    while(counter>0 )   //  && cycles < 10 if we wanna limit cycles
    {
        counter=0;
        counter += minimalInitialFlip1(pInOut, nVars);
        counter += minimalFlip1(pInOut, pAux, pAux1, nVars);
        counter += minimalSwap1(pInOut, pAux, pAux1, nVars);    
    }
    return CanonPhase;
}